

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

int add_A_multi_record(record *record,void **_data,int size)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  time_t tVar10;
  undefined8 *puVar11;
  size_t sVar12;
  char *__dest;
  ulong uVar13;
  undefined8 *puVar14;
  ulong uVar15;
  
  uVar15 = 0;
  tVar10 = time((time_t *)0x0);
  uVar13 = 0;
  if (0 < size) {
    uVar13 = (ulong)(uint)size;
  }
  puVar14 = (undefined8 *)0x0;
  for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
    if (tVar10 <= *(long *)((long)_data[uVar15] + 0x30)) {
      puVar11 = (undefined8 *)malloc(0x40);
      if (puVar14 == (undefined8 *)0x0) {
        record->data = puVar11;
        puVar14 = (undefined8 *)_data[uVar15];
        uVar3 = *puVar14;
        uVar4 = puVar14[1];
        uVar5 = puVar14[2];
        uVar6 = puVar14[3];
        uVar7 = puVar14[4];
        uVar8 = puVar14[5];
        uVar9 = puVar14[7];
        puVar11[6] = puVar14[6];
        puVar11[7] = uVar9;
        puVar11[4] = uVar7;
        puVar11[5] = uVar8;
        puVar11[2] = uVar5;
        puVar11[3] = uVar6;
        *puVar11 = uVar3;
        puVar11[1] = uVar4;
        sVar12 = strlen((char *)*puVar14);
        __dest = (char *)malloc((long)((int)sVar12 + 1));
        *puVar11 = __dest;
        strcpy(__dest,(char *)*puVar14);
        puVar14 = puVar11;
      }
      else {
        puVar14[7] = puVar11;
        puVar2 = (undefined8 *)_data[uVar15];
        uVar3 = *puVar2;
        uVar4 = puVar2[1];
        uVar5 = puVar2[2];
        uVar6 = puVar2[3];
        uVar7 = puVar2[4];
        uVar8 = puVar2[5];
        uVar9 = puVar2[7];
        puVar11[6] = puVar2[6];
        puVar11[7] = uVar9;
        puVar11[4] = uVar7;
        puVar11[5] = uVar8;
        puVar11[2] = uVar5;
        puVar11[3] = uVar6;
        *puVar11 = uVar3;
        puVar11[1] = uVar4;
        puVar14 = (undefined8 *)puVar14[7];
        *puVar14 = *record->data;
      }
      record->size = record->size + 0x40;
    }
  }
  iVar1 = record->size;
  if ((iVar1 != 0) && (puVar14 != (undefined8 *)0x0)) {
    puVar14[7] = 0;
  }
  return iVar1;
}

Assistant:

int add_A_multi_record(struct record*record,void*_data[],int size){
  //将会覆盖原来数据
  int sizeofstruct = sizeof(struct record_data),i,len;
  time_t now = time(NULL);
  struct record_data** data = (struct record_data**)_data;
  struct record_data*  dest = NULL;
  for(i=0;i<size;i++){
    if(now>(data[i]->ttl)){
      continue;
    }
    if(dest){
      //dest->next先被赋值，然后dest=dest->next
      //相当于转到下一个节点
      (dest)->next = malloc(sizeofstruct);
      // memcpy_s(dest->next,sizeofstruct,data[i],sizeofstruct);
      memcpy(dest->next,data[i],sizeofstruct);
      dest = dest->next;
      dest->label= ((struct record_data*)(record->data))->label;
      // (**dest).label = NULL;//复制label
    }else{
      dest = record->data = malloc(sizeofstruct);
      // memcpy_s(dest,sizeofstruct,data[i],sizeofstruct);
      memcpy(dest,data[i],sizeofstruct);
      len = strlen(data[i]->label) + 1;//注意加1
     dest->label = malloc(len);
    //  printf("%lld\n",(*dest)->label);
      strcpy(dest->label,data[i]->label);//复制name
      // strcpy_s(dest->label,len,data[i]->label);//复制name
    }
    #ifdef LOG_INCLUDED
    log_debug("add new A record;pre=%s  label= %s",data[0]->label,dest->label);
    #endif 

    record->size += sizeofstruct;
  }
  if(record->size&&dest)dest->next=NULL;
   #ifdef LOG_INCLUDED
    log_debug("first label:%s",((struct record_data*)(record->data))->label);
    #endif 
  return record->size;
}